

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O0

int __thiscall
vkt::memory::anon_unknown_0::BufferCopyToBuffer::verify
          (BufferCopyToBuffer *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
          size_t tbslen)

{
  RefData<vk::VkCommandBuffer_s_*> data_00;
  bool bVar1;
  deUint8 dVar2;
  deUint8 dVar3;
  VkResult result;
  int iVar4;
  int extraout_EAX;
  ResultCollector *this_00;
  ReferenceMemory *this_01;
  Context *pCVar5;
  DeviceInterface *vkd_00;
  VkDevice device_00;
  VkQueue queue_00;
  Handle<(vk::HandleType)8> *pHVar6;
  VkCommandBuffer_s **ppVVar7;
  Handle<(vk::HandleType)7> *pHVar8;
  undefined4 extraout_var;
  TestLog *this_02;
  MessageBuilder *pMVar9;
  Hex<8UL> *value;
  Hex<8UL> *value_00;
  MessageBuilder local_448;
  deUint64 local_2c8;
  string local_2c0;
  deUint64 local_2a0;
  string local_298;
  deUint64 local_278;
  string local_270;
  string local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  unsigned_long local_130;
  size_t pos;
  deUint8 *data;
  byte local_111;
  VkDeviceMemory VStack_110;
  bool isOk;
  void *local_108;
  void *ptr;
  VkBufferMemoryBarrier barrier;
  Move<vk::VkCommandBuffer_s_*> local_b0;
  RefData<vk::VkCommandBuffer_s_*> local_90;
  undefined1 local_70 [8];
  Unique<vk::VkCommandBuffer_s_*> commandBuffer;
  VkCommandPool commandPool;
  VkQueue queue;
  VkDevice device;
  DeviceInterface *vkd;
  ReferenceMemory_conflict *reference;
  ResultCollector *resultCollector;
  size_t commandIndex_local;
  VerifyContext *context_local;
  BufferCopyToBuffer *this_local;
  
  resultCollector = (ResultCollector *)sig;
  commandIndex_local = (size_t)ctx;
  context_local = (VerifyContext *)this;
  this_00 = VerifyContext::getResultCollector((VerifyContext *)ctx);
  this_01 = (ReferenceMemory *)VerifyContext::getReference((VerifyContext *)commandIndex_local);
  pCVar5 = VerifyContext::getContext((VerifyContext *)commandIndex_local);
  vkd_00 = Context::getDeviceInterface(pCVar5);
  pCVar5 = VerifyContext::getContext((VerifyContext *)commandIndex_local);
  device_00 = Context::getDevice(pCVar5);
  pCVar5 = VerifyContext::getContext((VerifyContext *)commandIndex_local);
  queue_00 = Context::getQueue(pCVar5);
  pCVar5 = VerifyContext::getContext((VerifyContext *)commandIndex_local);
  commandBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool =
       Context::getCommandPool(pCVar5);
  createBeginCommandBuffer
            (&local_b0,vkd_00,device_00,
             commandBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool,
             VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_90,(Move *)&local_b0);
  data_00.deleter.m_deviceIface._0_4_ = (int)local_90.deleter.m_deviceIface;
  data_00.object = local_90.object;
  data_00.deleter.m_deviceIface._4_4_ = (int)((ulong)local_90.deleter.m_deviceIface >> 0x20);
  data_00.deleter.m_device = local_90.deleter.m_device;
  data_00.deleter.m_pool.m_internal._0_4_ = (int)local_90.deleter.m_pool.m_internal;
  data_00.deleter.m_pool.m_internal._4_4_ = (int)(local_90.deleter.m_pool.m_internal >> 0x20);
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_70,data_00);
  ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::~Move(&local_b0);
  ptr._0_4_ = 0x2c;
  barrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  barrier._4_4_ = 0;
  barrier.pNext._0_4_ = 0x1000;
  barrier.pNext._4_4_ = 0x2000;
  barrier.srcAccessMask = 0xffffffff;
  barrier.dstAccessMask = 0xffffffff;
  pHVar6 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                     (&(this->m_dstBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>);
  barrier._24_8_ = pHVar6->m_internal;
  barrier.buffer.m_internal = 0;
  barrier.offset = 0xffffffffffffffff;
  ppVVar7 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_70);
  (*vkd_00->_vptr_DeviceInterface[0x6d])(vkd_00,*ppVVar7,0x1000,0x4000,0,0,0,1,&ptr,0,0);
  ppVVar7 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_70);
  result = (*vkd_00->_vptr_DeviceInterface[0x4a])(vkd_00,*ppVVar7);
  ::vk::checkResult(result,"vkd.endCommandBuffer(*commandBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/memory/vktMemoryPipelineBarrierTests.cpp"
                    ,0x92f);
  ppVVar7 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_70);
  queueRun(vkd_00,queue_00,*ppVVar7);
  pHVar8 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)7>_>::operator*
                     (&(this->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>);
  VStack_110.m_internal = pHVar8->m_internal;
  local_108 = mapMemory(vkd_00,device_00,VStack_110,this->m_bufferSize);
  local_111 = 1;
  pHVar8 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)7>_>::operator*
                     (&(this->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>);
  data = (deUint8 *)pHVar8->m_internal;
  ::vk::invalidateMappedMemoryRange(vkd_00,device_00,(VkDeviceMemory)data,0,this->m_bufferSize);
  pos = (size_t)local_108;
  local_130 = 0;
  do {
    if (this->m_bufferSize <= local_130) {
LAB_00c17d6c:
      pHVar8 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)7>_>::operator*
                         (&(this->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>);
      local_2c8 = pHVar8->m_internal;
      (*vkd_00->_vptr_DeviceInterface[8])(vkd_00,device_00,local_2c8);
      if ((local_111 & 1) == 0) {
        this_02 = VerifyContext::getLog((VerifyContext *)commandIndex_local);
        tcu::TestLog::operator<<(&local_448,this_02,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar9 = tcu::MessageBuilder::operator<<(&local_448,(unsigned_long *)&resultCollector);
        pMVar9 = tcu::MessageBuilder::operator<<
                           (pMVar9,(char (*) [44])": Buffer copy to buffer verification failed");
        tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_448);
      }
      ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::~Unique
                ((Unique<vk::VkCommandBuffer_s_*> *)local_70);
      return extraout_EAX;
    }
    bVar1 = ReferenceMemory::isDefined(this_01,local_130);
    if ((bVar1) &&
       (dVar3 = *(deUint8 *)(pos + local_130), dVar2 = ReferenceMemory::get(this_01,local_130),
       dVar3 != dVar2)) {
      de::toString<unsigned_long>(&local_250,(unsigned_long *)&resultCollector);
      std::operator+(&local_230,&local_250,":");
      iVar4 = (*(this->super_CmdCommand)._vptr_CmdCommand[2])();
      std::operator+(&local_210,&local_230,(char *)CONCAT44(extraout_var,iVar4));
      std::operator+(&local_1f0,&local_210," Result differs from reference, Expected: ");
      dVar3 = ReferenceMemory::get(this_01,local_130);
      local_278 = (deUint64)tcu::toHex<8ul,unsigned_char>(dVar3);
      de::toString<tcu::Format::Hex<8ul>>(&local_270,(de *)&local_278,value);
      std::operator+(&local_1d0,&local_1f0,&local_270);
      std::operator+(&local_1b0,&local_1d0,", Got: ");
      local_2a0 = (deUint64)tcu::toHex<8ul,unsigned_char>(*(uchar *)(pos + local_130));
      de::toString<tcu::Format::Hex<8ul>>(&local_298,(de *)&local_2a0,value_00);
      std::operator+(&local_190,&local_1b0,&local_298);
      std::operator+(&local_170,&local_190,", At offset: ");
      de::toString<unsigned_long>(&local_2c0,&local_130);
      std::operator+(&local_150,&local_170,&local_2c0);
      tcu::ResultCollector::fail(this_00,&local_150);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&local_2c0);
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string((string *)&local_190);
      std::__cxx11::string::~string((string *)&local_298);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::__cxx11::string::~string((string *)&local_270);
      std::__cxx11::string::~string((string *)&local_1f0);
      std::__cxx11::string::~string((string *)&local_210);
      std::__cxx11::string::~string((string *)&local_230);
      std::__cxx11::string::~string((string *)&local_250);
      goto LAB_00c17d6c;
    }
    local_130 = local_130 + 1;
  } while( true );
}

Assistant:

void BufferCopyToBuffer::verify (VerifyContext& context, size_t commandIndex)
{
	tcu::ResultCollector&					resultCollector	(context.getResultCollector());
	ReferenceMemory&						reference		(context.getReference());
	const vk::DeviceInterface&				vkd				= context.getContext().getDeviceInterface();
	const vk::VkDevice						device			= context.getContext().getDevice();
	const vk::VkQueue						queue			= context.getContext().getQueue();
	const vk::VkCommandPool					commandPool		= context.getContext().getCommandPool();
	const vk::Unique<vk::VkCommandBuffer>	commandBuffer	(createBeginCommandBuffer(vkd, device, commandPool, vk::VK_COMMAND_BUFFER_LEVEL_PRIMARY));
	const vk::VkBufferMemoryBarrier			barrier			=
	{
		vk::VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER,
		DE_NULL,

		vk::VK_ACCESS_TRANSFER_WRITE_BIT,
		vk::VK_ACCESS_HOST_READ_BIT,

		VK_QUEUE_FAMILY_IGNORED,
		VK_QUEUE_FAMILY_IGNORED,
		*m_dstBuffer,
		0,
		VK_WHOLE_SIZE
	};

	vkd.cmdPipelineBarrier(*commandBuffer, vk::VK_PIPELINE_STAGE_TRANSFER_BIT, vk::VK_PIPELINE_STAGE_HOST_BIT, (vk::VkDependencyFlags)0, 0, (const vk::VkMemoryBarrier*)DE_NULL, 1, &barrier, 0, (const vk::VkImageMemoryBarrier*)DE_NULL);

	VK_CHECK(vkd.endCommandBuffer(*commandBuffer));
	queueRun(vkd, queue, *commandBuffer);

	{
		void* const	ptr		= mapMemory(vkd, device, *m_memory, m_bufferSize);
		bool		isOk	= true;

		vk::invalidateMappedMemoryRange(vkd, device, *m_memory, 0, m_bufferSize);

		{
			const deUint8* const data = (const deUint8*)ptr;

			for (size_t pos = 0; pos < (size_t)m_bufferSize; pos++)
			{
				if (reference.isDefined(pos))
				{
					if (data[pos] != reference.get(pos))
					{
						resultCollector.fail(
								de::toString(commandIndex) + ":" + getName()
								+ " Result differs from reference, Expected: "
								+ de::toString(tcu::toHex<8>(reference.get(pos)))
								+ ", Got: "
								+ de::toString(tcu::toHex<8>(data[pos]))
								+ ", At offset: "
								+ de::toString(pos));
						break;
					}
				}
			}
		}

		vkd.unmapMemory(device, *m_memory);

		if (!isOk)
			context.getLog() << TestLog::Message << commandIndex << ": Buffer copy to buffer verification failed" << TestLog::EndMessage;
	}
}